

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void kvid2buf(size_t chunksize,fdb_kvs_id_t id,void *buf)

{
  void *in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  size_t size_id;
  ulong local_10;
  ulong local_8;
  
  local_10 = in_RSI >> 0x38 | (in_RSI & 0xff000000000000) >> 0x28 |
             (in_RSI & 0xff0000000000) >> 0x18 | (in_RSI & 0xff00000000) >> 8 |
             (in_RSI & 0xff000000) << 8 | (in_RSI & 0xff0000) << 0x18 | (in_RSI & 0xff00) << 0x28 |
             in_RSI << 0x38;
  if (in_RDI == 8) {
    memcpy(in_RDX,&local_10,8);
  }
  else if (in_RDI < 8) {
    memcpy(in_RDX,(void *)((long)&local_8 - in_RDI),in_RDI);
  }
  else {
    local_8 = in_RDI;
    memset(in_RDX,0,in_RDI - 8);
    memcpy((void *)((long)in_RDX + (local_8 - 8)),&local_10,8);
  }
  return;
}

Assistant:

void kvid2buf(size_t chunksize, fdb_kvs_id_t id, void *buf)
{
    size_t size_id = sizeof(fdb_kvs_id_t);
    id = _endian_encode(id);

    if (chunksize == size_id) {
        memcpy(buf, &id, size_id);
    } else if (chunksize < size_id) {
        memcpy(buf, (uint8_t*)&id + (size_id - chunksize), chunksize);
    } else { // chunksize > sizeof(fdb_kvs_id_t)
        memset(buf, 0x0, chunksize - size_id);
        memcpy((uint8_t*)buf + (chunksize - size_id), &id, size_id);
    }
}